

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_arithm<float>(uint length,float value1,float value2,bool allowTrash)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  float *pfVar8;
  element_type *peVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint local_1ed0;
  uint local_1ecc;
  uint i_10;
  uint i_9;
  uint i_8;
  uint i_7;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  float r;
  uint i;
  float *result;
  float *v2;
  float *v1;
  shared_ptr<float> presult;
  undefined1 local_1e68 [8];
  shared_ptr<float> pv2;
  shared_ptr<float> pv1;
  bool allowTrash_local;
  float value2_local;
  float value1_local;
  uint length_local;
  __m128 a;
  uint local_1cbc;
  undefined1 (*local_1cb8) [16];
  __m128 a_1;
  uint local_1c8c;
  undefined1 (*local_1c88) [16];
  __m128 b0_2;
  __m128 a0_2;
  __m128 b0_1;
  __m128 a0_1;
  __m128 b1;
  __m128 b0;
  __m128 a1;
  __m128 a0;
  element_type *local_1830;
  undefined1 (*local_1828) [16];
  undefined1 (*local_1820) [16];
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  __m128 b0_5;
  __m128 a0_5;
  __m128 b0_4;
  __m128 a0_4;
  __m128 b1_1;
  __m128 b0_3;
  __m128 a1_1;
  __m128 a0_3;
  element_type *local_1590;
  undefined1 (*local_1588) [16];
  undefined1 (*local_1580) [16];
  float local_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  float local_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  __m128 b0_8;
  __m128 a0_8;
  __m128 b0_7;
  __m128 a0_7;
  __m128 b1_2;
  __m128 b0_6;
  __m128 a1_2;
  __m128 a0_6;
  element_type *local_12f0;
  undefined1 (*local_12e8) [16];
  undefined1 (*local_12e0) [16];
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  __m128 b0_11;
  __m128 a0_11;
  __m128 b0_10;
  __m128 a0_10;
  __m128 b1_3;
  __m128 b0_9;
  __m128 a1_3;
  __m128 a0_9;
  element_type *local_1050;
  undefined1 (*local_1048) [16];
  undefined1 (*local_1040) [16];
  __m128 a0_14;
  __m128 a0_13;
  __m128 a1_4;
  __m128 a0_12;
  __m128 b;
  element_type *local_de0;
  undefined1 (*local_dd0) [16];
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float local_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  __m128 a0_17;
  __m128 a0_16;
  __m128 a1_5;
  __m128 a0_15;
  __m128 b_1;
  element_type *local_ba0;
  undefined1 (*local_b90) [16];
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  __m128 a0_20;
  __m128 a0_19;
  __m128 a1_6;
  __m128 a0_18;
  __m128 b_2;
  element_type *local_970;
  undefined1 (*local_960) [16];
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  __m128 a0_23;
  __m128 a0_22;
  __m128 a1_7;
  __m128 a0_21;
  __m128 b_3;
  element_type *local_6c0;
  undefined1 (*local_6b0) [16];
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  __m128 a0_26;
  __m128 a0_25;
  __m128 a1_8;
  __m128 a0_24;
  __m128 b_4;
  element_type *local_490;
  undefined1 (*local_480) [16];
  __m128 a0_29;
  __m128 a0_28;
  __m128 a1_9;
  __m128 a0_27;
  __m128 b_5;
  element_type *local_260;
  undefined1 (*local_250) [16];
  
  pfVar8 = sse::common::malloc<float>(length);
  std::shared_ptr<float>::shared_ptr<float,void(*)(float*),void>
            ((shared_ptr<float> *)
             &pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pfVar8,
             sse::common::free<float>);
  pfVar8 = sse::common::malloc<float>(length);
  std::shared_ptr<float>::shared_ptr<float,void(*)(float*),void>
            ((shared_ptr<float> *)local_1e68,pfVar8,sse::common::free<float>);
  pfVar8 = sse::common::malloc<float>(length + 1);
  std::shared_ptr<float>::shared_ptr<float,void(*)(float*),void>
            ((shared_ptr<float> *)&v1,pfVar8,sse::common::free<float>);
  local_250 = (undefined1 (*) [16])
              std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)
                         &pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1048 = (undefined1 (*) [16])
               std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)local_1e68);
  peVar9 = std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)&v1);
  peVar9[length] = 127.0;
  uVar1 = CONCAT44(value1,value1);
  uVar2 = CONCAT44(value1,value1);
  local_1cb8 = local_250;
  for (local_1cbc = length; 0xf < (int)local_1cbc; local_1cbc = local_1cbc - 0x10) {
    *(undefined8 *)*local_1cb8 = uVar1;
    *(undefined8 *)(*local_1cb8 + 8) = uVar2;
    *(undefined8 *)local_1cb8[1] = uVar1;
    *(undefined8 *)(local_1cb8[1] + 8) = uVar2;
    *(undefined8 *)local_1cb8[2] = uVar1;
    *(undefined8 *)(local_1cb8[2] + 8) = uVar2;
    *(undefined8 *)local_1cb8[3] = uVar1;
    *(undefined8 *)(local_1cb8[3] + 8) = uVar2;
    local_1cb8 = local_1cb8 + 4;
  }
  if (7 < (int)local_1cbc) {
    *(undefined8 *)*local_1cb8 = uVar1;
    *(undefined8 *)(*local_1cb8 + 8) = uVar2;
    *(undefined8 *)local_1cb8[1] = uVar1;
    *(undefined8 *)(local_1cb8[1] + 8) = uVar2;
    local_1cbc = local_1cbc - 8;
    local_1cb8 = local_1cb8 + 2;
  }
  if (3 < (int)local_1cbc) {
    *(undefined8 *)*local_1cb8 = uVar1;
    *(undefined8 *)(*local_1cb8 + 8) = uVar2;
    local_1cbc = local_1cbc - 4;
    local_1cb8 = local_1cb8 + 1;
  }
  for (; 0 < (int)local_1cbc; local_1cbc = local_1cbc - 1) {
    *(float *)*local_1cb8 = value1;
    local_1cb8 = (undefined1 (*) [16])(*local_1cb8 + 4);
  }
  uVar1 = CONCAT44(value2,value2);
  uVar2 = CONCAT44(value2,value2);
  local_1c88 = local_1048;
  for (local_1c8c = length; 0xf < (int)local_1c8c; local_1c8c = local_1c8c - 0x10) {
    *(undefined8 *)*local_1c88 = uVar1;
    *(undefined8 *)(*local_1c88 + 8) = uVar2;
    *(undefined8 *)local_1c88[1] = uVar1;
    *(undefined8 *)(local_1c88[1] + 8) = uVar2;
    *(undefined8 *)local_1c88[2] = uVar1;
    *(undefined8 *)(local_1c88[2] + 8) = uVar2;
    *(undefined8 *)local_1c88[3] = uVar1;
    *(undefined8 *)(local_1c88[3] + 8) = uVar2;
    local_1c88 = local_1c88 + 4;
  }
  if (7 < (int)local_1c8c) {
    *(undefined8 *)*local_1c88 = uVar1;
    *(undefined8 *)(*local_1c88 + 8) = uVar2;
    *(undefined8 *)local_1c88[1] = uVar1;
    *(undefined8 *)(local_1c88[1] + 8) = uVar2;
    local_1c8c = local_1c8c - 8;
    local_1c88 = local_1c88 + 2;
  }
  if (3 < (int)local_1c8c) {
    *(undefined8 *)*local_1c88 = uVar1;
    *(undefined8 *)(*local_1c88 + 8) = uVar2;
    local_1c8c = local_1c8c - 4;
    local_1c88 = local_1c88 + 1;
  }
  for (; 0 < (int)local_1c8c; local_1c8c = local_1c8c - 1) {
    *(float *)*local_1c88 = value2;
    local_1c88 = (undefined1 (*) [16])(*local_1c88 + 4);
  }
  for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(*(float *)(*local_250 + (ulong)i_1 * 4),value1);
    if ((!bVar7) ||
       (bVar7 = anon_unknown.dwarf_157a4::equal<float>
                          (*(float *)(*local_1048 + (ulong)i_1 * 4),value2), !bVar7)) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x1a;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  local_1830 = peVar9;
  local_1828 = local_1048;
  local_1820 = local_250;
  for (a0[3] = (float)length; 7 < (int)a0[3]; a0[3] = (float)((int)a0[3] + -8)) {
    local_1728 = (float)*(undefined8 *)*local_1820;
    fStack_1724 = (float)((ulong)*(undefined8 *)*local_1820 >> 0x20);
    fStack_1720 = (float)*(undefined8 *)(*local_1820 + 8);
    fStack_171c = (float)((ulong)*(undefined8 *)(*local_1820 + 8) >> 0x20);
    local_1738 = (float)*(undefined8 *)*local_1828;
    fStack_1734 = (float)((ulong)*(undefined8 *)*local_1828 >> 0x20);
    fStack_1730 = (float)*(undefined8 *)(*local_1828 + 8);
    fStack_172c = (float)((ulong)*(undefined8 *)(*local_1828 + 8) >> 0x20);
    a1[3] = fStack_1724 + fStack_1734;
    a1[2] = local_1728 + local_1738;
    a0[1] = fStack_171c + fStack_172c;
    a0[0] = fStack_1720 + fStack_1730;
    local_1748 = (float)*(undefined8 *)local_1820[1];
    fStack_1744 = (float)((ulong)*(undefined8 *)local_1820[1] >> 0x20);
    fStack_1740 = (float)*(undefined8 *)(local_1820[1] + 8);
    fStack_173c = (float)((ulong)*(undefined8 *)(local_1820[1] + 8) >> 0x20);
    local_1758 = (float)*(undefined8 *)local_1828[1];
    fStack_1754 = (float)((ulong)*(undefined8 *)local_1828[1] >> 0x20);
    fStack_1750 = (float)*(undefined8 *)(local_1828[1] + 8);
    fStack_174c = (float)((ulong)*(undefined8 *)(local_1828[1] + 8) >> 0x20);
    b0[3] = fStack_1744 + fStack_1754;
    b0[2] = local_1748 + local_1758;
    a1[1] = fStack_173c + fStack_174c;
    a1[0] = fStack_1740 + fStack_1750;
    *(undefined8 *)local_1830 = a1._8_8_;
    *(undefined8 *)(local_1830 + 2) = a0._0_8_;
    *(undefined8 *)(local_1830 + 4) = b0._8_8_;
    *(undefined8 *)(local_1830 + 6) = a1._0_8_;
    local_1820 = local_1820 + 2;
    local_1828 = local_1828 + 2;
    local_1830 = local_1830 + 8;
  }
  if (3 < (int)a0[3]) {
    local_1708 = (float)*(undefined8 *)*local_1820;
    fStack_1704 = (float)((ulong)*(undefined8 *)*local_1820 >> 0x20);
    fStack_1700 = (float)*(undefined8 *)(*local_1820 + 8);
    fStack_16fc = (float)((ulong)*(undefined8 *)(*local_1820 + 8) >> 0x20);
    local_1718 = (float)*(undefined8 *)*local_1828;
    fStack_1714 = (float)((ulong)*(undefined8 *)*local_1828 >> 0x20);
    fStack_1710 = (float)*(undefined8 *)(*local_1828 + 8);
    fStack_170c = (float)((ulong)*(undefined8 *)(*local_1828 + 8) >> 0x20);
    b0_1[3] = fStack_1704 + fStack_1714;
    b0_1[2] = local_1708 + local_1718;
    a0_1[1] = fStack_16fc + fStack_170c;
    a0_1[0] = fStack_1700 + fStack_1710;
    *(undefined8 *)local_1830 = b0_1._8_8_;
    *(undefined8 *)(local_1830 + 2) = a0_1._0_8_;
    a0[3] = (float)((int)a0[3] + -4);
    local_1820 = local_1820 + 1;
    local_1828 = local_1828 + 1;
    local_1830 = local_1830 + 4;
  }
  for (; 0 < (int)a0[3]; a0[3] = (float)((int)a0[3] + -1)) {
    *local_1830 = *(float *)*local_1820 + *(float *)*local_1828;
    local_1820 = (undefined1 (*) [16])(*local_1820 + 4);
    local_1828 = (undefined1 (*) [16])(*local_1828 + 4);
    local_1830 = local_1830 + 1;
  }
  for (i_3 = 0; i_3 < length; i_3 = i_3 + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(peVar9[i_3],value1 + value2);
    if (!bVar7) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x22;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  local_1590 = peVar9;
  local_1588 = local_1048;
  local_1580 = local_250;
  for (a0_3[3] = (float)length; 7 < (int)a0_3[3]; a0_3[3] = (float)((int)a0_3[3] + -8)) {
    local_13c8 = (float)*(undefined8 *)*local_1580;
    fStack_13c4 = (float)((ulong)*(undefined8 *)*local_1580 >> 0x20);
    fStack_13c0 = (float)*(undefined8 *)(*local_1580 + 8);
    fStack_13bc = (float)((ulong)*(undefined8 *)(*local_1580 + 8) >> 0x20);
    local_13d8 = (float)*(undefined8 *)*local_1588;
    fStack_13d4 = (float)((ulong)*(undefined8 *)*local_1588 >> 0x20);
    fStack_13d0 = (float)*(undefined8 *)(*local_1588 + 8);
    fStack_13cc = (float)((ulong)*(undefined8 *)(*local_1588 + 8) >> 0x20);
    a1_1[3] = fStack_13c4 - fStack_13d4;
    a1_1[2] = local_13c8 - local_13d8;
    a0_3[1] = fStack_13bc - fStack_13cc;
    a0_3[0] = fStack_13c0 - fStack_13d0;
    local_13e8 = (float)*(undefined8 *)local_1580[1];
    fStack_13e4 = (float)((ulong)*(undefined8 *)local_1580[1] >> 0x20);
    fStack_13e0 = (float)*(undefined8 *)(local_1580[1] + 8);
    fStack_13dc = (float)((ulong)*(undefined8 *)(local_1580[1] + 8) >> 0x20);
    local_13f8 = (float)*(undefined8 *)local_1588[1];
    fStack_13f4 = (float)((ulong)*(undefined8 *)local_1588[1] >> 0x20);
    fStack_13f0 = (float)*(undefined8 *)(local_1588[1] + 8);
    fStack_13ec = (float)((ulong)*(undefined8 *)(local_1588[1] + 8) >> 0x20);
    b0_3[3] = fStack_13e4 - fStack_13f4;
    b0_3[2] = local_13e8 - local_13f8;
    a1_1[1] = fStack_13dc - fStack_13ec;
    a1_1[0] = fStack_13e0 - fStack_13f0;
    *(undefined8 *)local_1590 = a1_1._8_8_;
    *(undefined8 *)(local_1590 + 2) = a0_3._0_8_;
    *(undefined8 *)(local_1590 + 4) = b0_3._8_8_;
    *(undefined8 *)(local_1590 + 6) = a1_1._0_8_;
    local_1580 = local_1580 + 2;
    local_1588 = local_1588 + 2;
    local_1590 = local_1590 + 8;
  }
  if (3 < (int)a0_3[3]) {
    local_13a8 = (float)*(undefined8 *)*local_1580;
    fStack_13a4 = (float)((ulong)*(undefined8 *)*local_1580 >> 0x20);
    fStack_13a0 = (float)*(undefined8 *)(*local_1580 + 8);
    fStack_139c = (float)((ulong)*(undefined8 *)(*local_1580 + 8) >> 0x20);
    local_13b8 = (float)*(undefined8 *)*local_1588;
    fStack_13b4 = (float)((ulong)*(undefined8 *)*local_1588 >> 0x20);
    fStack_13b0 = (float)*(undefined8 *)(*local_1588 + 8);
    fStack_13ac = (float)((ulong)*(undefined8 *)(*local_1588 + 8) >> 0x20);
    b0_4[3] = fStack_13a4 - fStack_13b4;
    b0_4[2] = local_13a8 - local_13b8;
    a0_4[1] = fStack_139c - fStack_13ac;
    a0_4[0] = fStack_13a0 - fStack_13b0;
    *(undefined8 *)local_1590 = b0_4._8_8_;
    *(undefined8 *)(local_1590 + 2) = a0_4._0_8_;
    a0_3[3] = (float)((int)a0_3[3] + -4);
    local_1580 = local_1580 + 1;
    local_1588 = local_1588 + 1;
    local_1590 = local_1590 + 4;
  }
  for (; 0 < (int)a0_3[3]; a0_3[3] = (float)((int)a0_3[3] + -1)) {
    *local_1590 = *(float *)*local_1580 - *(float *)*local_1588;
    local_1580 = (undefined1 (*) [16])(*local_1580 + 4);
    local_1588 = (undefined1 (*) [16])(*local_1588 + 4);
    local_1590 = local_1590 + 1;
  }
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(peVar9[i_4],value1 - value2);
    if (!bVar7) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x2a;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  local_12f0 = peVar9;
  local_12e8 = local_1048;
  local_12e0 = local_250;
  for (a0_6[3] = (float)length; 7 < (int)a0_6[3]; a0_6[3] = (float)((int)a0_6[3] + -8)) {
    local_1128 = (float)*(undefined8 *)*local_12e0;
    fStack_1124 = (float)((ulong)*(undefined8 *)*local_12e0 >> 0x20);
    fStack_1120 = (float)*(undefined8 *)(*local_12e0 + 8);
    fStack_111c = (float)((ulong)*(undefined8 *)(*local_12e0 + 8) >> 0x20);
    local_1138 = (float)*(undefined8 *)*local_12e8;
    fStack_1134 = (float)((ulong)*(undefined8 *)*local_12e8 >> 0x20);
    fStack_1130 = (float)*(undefined8 *)(*local_12e8 + 8);
    fStack_112c = (float)((ulong)*(undefined8 *)(*local_12e8 + 8) >> 0x20);
    a1_2[3] = fStack_1124 * fStack_1134;
    a1_2[2] = local_1128 * local_1138;
    a0_6[1] = fStack_111c * fStack_112c;
    a0_6[0] = fStack_1120 * fStack_1130;
    local_1148 = (float)*(undefined8 *)local_12e0[1];
    fStack_1144 = (float)((ulong)*(undefined8 *)local_12e0[1] >> 0x20);
    fStack_1140 = (float)*(undefined8 *)(local_12e0[1] + 8);
    fStack_113c = (float)((ulong)*(undefined8 *)(local_12e0[1] + 8) >> 0x20);
    local_1158 = (float)*(undefined8 *)local_12e8[1];
    fStack_1154 = (float)((ulong)*(undefined8 *)local_12e8[1] >> 0x20);
    fStack_1150 = (float)*(undefined8 *)(local_12e8[1] + 8);
    fStack_114c = (float)((ulong)*(undefined8 *)(local_12e8[1] + 8) >> 0x20);
    b0_6[3] = fStack_1144 * fStack_1154;
    b0_6[2] = local_1148 * local_1158;
    a1_2[1] = fStack_113c * fStack_114c;
    a1_2[0] = fStack_1140 * fStack_1150;
    *(undefined8 *)local_12f0 = a1_2._8_8_;
    *(undefined8 *)(local_12f0 + 2) = a0_6._0_8_;
    *(undefined8 *)(local_12f0 + 4) = b0_6._8_8_;
    *(undefined8 *)(local_12f0 + 6) = a1_2._0_8_;
    local_12e0 = local_12e0 + 2;
    local_12e8 = local_12e8 + 2;
    local_12f0 = local_12f0 + 8;
  }
  if (3 < (int)a0_6[3]) {
    local_1108 = (float)*(undefined8 *)*local_12e0;
    fStack_1104 = (float)((ulong)*(undefined8 *)*local_12e0 >> 0x20);
    fStack_1100 = (float)*(undefined8 *)(*local_12e0 + 8);
    fStack_10fc = (float)((ulong)*(undefined8 *)(*local_12e0 + 8) >> 0x20);
    local_1118 = (float)*(undefined8 *)*local_12e8;
    fStack_1114 = (float)((ulong)*(undefined8 *)*local_12e8 >> 0x20);
    fStack_1110 = (float)*(undefined8 *)(*local_12e8 + 8);
    fStack_110c = (float)((ulong)*(undefined8 *)(*local_12e8 + 8) >> 0x20);
    b0_7[3] = fStack_1104 * fStack_1114;
    b0_7[2] = local_1108 * local_1118;
    a0_7[1] = fStack_10fc * fStack_110c;
    a0_7[0] = fStack_1100 * fStack_1110;
    *(undefined8 *)local_12f0 = b0_7._8_8_;
    *(undefined8 *)(local_12f0 + 2) = a0_7._0_8_;
    a0_6[3] = (float)((int)a0_6[3] + -4);
    local_12e0 = local_12e0 + 1;
    local_12e8 = local_12e8 + 1;
    local_12f0 = local_12f0 + 4;
  }
  for (; 0 < (int)a0_6[3]; a0_6[3] = (float)((int)a0_6[3] + -1)) {
    *local_12f0 = *(float *)*local_12e0 * *(float *)*local_12e8;
    local_12e0 = (undefined1 (*) [16])(*local_12e0 + 4);
    local_12e8 = (undefined1 (*) [16])(*local_12e8 + 4);
    local_12f0 = local_12f0 + 1;
  }
  for (i_5 = 0; i_5 < length; i_5 = i_5 + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(peVar9[i_5],value1 * value2);
    if (!bVar7) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x32;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  local_1050 = peVar9;
  local_1040 = local_250;
  for (a0_9[3] = (float)length; 7 < (int)a0_9[3]; a0_9[3] = (float)((int)a0_9[3] + -8)) {
    auVar11 = divps(*local_1040,*local_1048);
    auVar12 = divps(local_1040[1],local_1048[1]);
    a1_3._8_8_ = auVar11._0_8_;
    a0_9._0_8_ = auVar11._8_8_;
    *(undefined8 *)local_1050 = a1_3._8_8_;
    *(undefined8 *)(local_1050 + 2) = a0_9._0_8_;
    b0_9._8_8_ = auVar12._0_8_;
    a1_3._0_8_ = auVar12._8_8_;
    *(undefined8 *)(local_1050 + 4) = b0_9._8_8_;
    *(undefined8 *)(local_1050 + 6) = a1_3._0_8_;
    local_1040 = local_1040 + 2;
    local_1048 = local_1048 + 2;
    local_1050 = local_1050 + 8;
  }
  if (3 < (int)a0_9[3]) {
    auVar11 = divps(*local_1040,*local_1048);
    b0_10._8_8_ = auVar11._0_8_;
    a0_10._0_8_ = auVar11._8_8_;
    *(undefined8 *)local_1050 = b0_10._8_8_;
    *(undefined8 *)(local_1050 + 2) = a0_10._0_8_;
    a0_9[3] = (float)((int)a0_9[3] + -4);
    local_1040 = local_1040 + 1;
    local_1048 = local_1048 + 1;
    local_1050 = local_1050 + 4;
  }
  for (; 0 < (int)a0_9[3]; a0_9[3] = (float)((int)a0_9[3] + -1)) {
    *local_1050 = *(float *)*local_1040 / *(float *)*local_1048;
    local_1040 = (undefined1 (*) [16])(*local_1040 + 4);
    local_1048 = (undefined1 (*) [16])(*local_1048 + 4);
    local_1050 = local_1050 + 1;
  }
  for (i_6 = 0; i_6 < length; i_6 = i_6 + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(peVar9[i_6],value1 / value2);
    if (!bVar7) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x3a;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  local_de0 = peVar9;
  local_dd0 = local_250;
  for (b[3] = (float)length; 7 < (int)b[3]; b[3] = (float)((int)b[3] + -8)) {
    local_c98 = (float)*(undefined8 *)*local_dd0;
    fStack_c94 = (float)((ulong)*(undefined8 *)*local_dd0 >> 0x20);
    fStack_c90 = (float)*(undefined8 *)(*local_dd0 + 8);
    fStack_c8c = (float)((ulong)*(undefined8 *)(*local_dd0 + 8) >> 0x20);
    a1_4[3] = fStack_c94 + value2;
    a1_4[2] = local_c98 + value2;
    a0_12[1] = fStack_c8c + value2;
    a0_12[0] = fStack_c90 + value2;
    local_cb8 = (float)*(undefined8 *)local_dd0[1];
    fStack_cb4 = (float)((ulong)*(undefined8 *)local_dd0[1] >> 0x20);
    fStack_cb0 = (float)*(undefined8 *)(local_dd0[1] + 8);
    fStack_cac = (float)((ulong)*(undefined8 *)(local_dd0[1] + 8) >> 0x20);
    a0_13[3] = fStack_cb4 + value2;
    a0_13[2] = local_cb8 + value2;
    a1_4[1] = fStack_cac + value2;
    a1_4[0] = fStack_cb0 + value2;
    *(undefined8 *)local_de0 = a1_4._8_8_;
    *(undefined8 *)(local_de0 + 2) = a0_12._0_8_;
    *(undefined8 *)(local_de0 + 4) = a0_13._8_8_;
    *(undefined8 *)(local_de0 + 6) = a1_4._0_8_;
    local_dd0 = local_dd0 + 2;
    local_de0 = local_de0 + 8;
  }
  if (3 < (int)b[3]) {
    local_cd8 = (float)*(undefined8 *)*local_dd0;
    fStack_cd4 = (float)((ulong)*(undefined8 *)*local_dd0 >> 0x20);
    fStack_cd0 = (float)*(undefined8 *)(*local_dd0 + 8);
    fStack_ccc = (float)((ulong)*(undefined8 *)(*local_dd0 + 8) >> 0x20);
    a0_14[3] = fStack_cd4 + value2;
    a0_14[2] = local_cd8 + value2;
    a0_13[1] = fStack_ccc + value2;
    a0_13[0] = fStack_cd0 + value2;
    *(undefined8 *)local_de0 = a0_14._8_8_;
    *(undefined8 *)(local_de0 + 2) = a0_13._0_8_;
    b[3] = (float)((int)b[3] + -4);
    local_dd0 = local_dd0 + 1;
    local_de0 = local_de0 + 4;
  }
  for (; 0 < (int)b[3]; b[3] = (float)((int)b[3] + -1)) {
    *local_de0 = *(float *)*local_dd0 + value2;
    local_dd0 = (undefined1 (*) [16])(*local_dd0 + 4);
    local_de0 = local_de0 + 1;
  }
  for (i_7 = 0; i_7 < length; i_7 = i_7 + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(peVar9[i_7],value1 + value2);
    if (!bVar7) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x43;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  local_ba0 = peVar9;
  local_b90 = local_250;
  for (b_1[3] = (float)length; 7 < (int)b_1[3]; b_1[3] = (float)((int)b_1[3] + -8)) {
    local_9f8 = (float)*(undefined8 *)*local_b90;
    fStack_9f4 = (float)((ulong)*(undefined8 *)*local_b90 >> 0x20);
    fStack_9f0 = (float)*(undefined8 *)(*local_b90 + 8);
    fStack_9ec = (float)((ulong)*(undefined8 *)(*local_b90 + 8) >> 0x20);
    a1_5[3] = fStack_9f4 - value2;
    a1_5[2] = local_9f8 - value2;
    a0_15[1] = fStack_9ec - value2;
    a0_15[0] = fStack_9f0 - value2;
    a0_16[2] = (float)*(undefined8 *)local_b90[1];
    a0_16[3] = (float)((ulong)*(undefined8 *)local_b90[1] >> 0x20);
    a1_5[0] = (float)*(undefined8 *)(local_b90[1] + 8);
    a1_5[1] = (float)((ulong)*(undefined8 *)(local_b90[1] + 8) >> 0x20);
    a0_16[3] = a0_16[3] - value2;
    a0_16[2] = a0_16[2] - value2;
    a1_5[1] = a1_5[1] - value2;
    a1_5[0] = a1_5[0] - value2;
    *(undefined8 *)local_ba0 = a1_5._8_8_;
    *(undefined8 *)(local_ba0 + 2) = a0_15._0_8_;
    *(undefined8 *)(local_ba0 + 4) = a0_16._8_8_;
    *(undefined8 *)(local_ba0 + 6) = a1_5._0_8_;
    local_b90 = local_b90 + 2;
    local_ba0 = local_ba0 + 8;
  }
  if (3 < (int)b_1[3]) {
    a0_17[2] = (float)*(undefined8 *)*local_b90;
    a0_17[3] = (float)((ulong)*(undefined8 *)*local_b90 >> 0x20);
    a0_16[0] = (float)*(undefined8 *)(*local_b90 + 8);
    a0_16[1] = (float)((ulong)*(undefined8 *)(*local_b90 + 8) >> 0x20);
    a0_17[3] = a0_17[3] - value2;
    a0_17[2] = a0_17[2] - value2;
    a0_16[1] = a0_16[1] - value2;
    a0_16[0] = a0_16[0] - value2;
    *(undefined8 *)local_ba0 = a0_17._8_8_;
    *(undefined8 *)(local_ba0 + 2) = a0_16._0_8_;
    b_1[3] = (float)((int)b_1[3] + -4);
    local_b90 = local_b90 + 1;
    local_ba0 = local_ba0 + 4;
  }
  for (; 0 < (int)b_1[3]; b_1[3] = (float)((int)b_1[3] + -1)) {
    *local_ba0 = *(float *)*local_b90 - value2;
    local_b90 = (undefined1 (*) [16])(*local_b90 + 4);
    local_ba0 = local_ba0 + 1;
  }
  for (i_8 = 0; i_8 < length; i_8 = i_8 + 1) {
    if ((peVar9[i_8] != value1 - value2) || (NAN(peVar9[i_8]) || NAN(value1 - value2))) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x4b;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  local_970 = peVar9;
  local_960 = local_250;
  for (b_2[3] = (float)length; 7 < (int)b_2[3]; b_2[3] = (float)((int)b_2[3] + -8)) {
    local_7b8 = (float)*(undefined8 *)*local_960;
    fStack_7b4 = (float)((ulong)*(undefined8 *)*local_960 >> 0x20);
    fStack_7b0 = (float)*(undefined8 *)(*local_960 + 8);
    fStack_7ac = (float)((ulong)*(undefined8 *)(*local_960 + 8) >> 0x20);
    a1_6[3] = value2 - fStack_7b4;
    a1_6[2] = value2 - local_7b8;
    a0_18[1] = value2 - fStack_7ac;
    a0_18[0] = value2 - fStack_7b0;
    local_7f8 = (float)*(undefined8 *)local_960[1];
    fStack_7f4 = (float)((ulong)*(undefined8 *)local_960[1] >> 0x20);
    fStack_7f0 = (float)*(undefined8 *)(local_960[1] + 8);
    fStack_7ec = (float)((ulong)*(undefined8 *)(local_960[1] + 8) >> 0x20);
    a0_19[3] = value2 - fStack_7f4;
    a0_19[2] = value2 - local_7f8;
    a1_6[1] = value2 - fStack_7ec;
    a1_6[0] = value2 - fStack_7f0;
    *(undefined8 *)local_970 = a1_6._8_8_;
    *(undefined8 *)(local_970 + 2) = a0_18._0_8_;
    *(undefined8 *)(local_970 + 4) = a0_19._8_8_;
    *(undefined8 *)(local_970 + 6) = a1_6._0_8_;
    local_960 = local_960 + 2;
    local_970 = local_970 + 8;
  }
  if (3 < (int)b_2[3]) {
    local_778 = (float)*(undefined8 *)*local_960;
    fStack_774 = (float)((ulong)*(undefined8 *)*local_960 >> 0x20);
    fStack_770 = (float)*(undefined8 *)(*local_960 + 8);
    fStack_76c = (float)((ulong)*(undefined8 *)(*local_960 + 8) >> 0x20);
    a0_20[3] = value2 - fStack_774;
    a0_20[2] = value2 - local_778;
    a0_19[1] = value2 - fStack_76c;
    a0_19[0] = value2 - fStack_770;
    *(undefined8 *)local_970 = a0_20._8_8_;
    *(undefined8 *)(local_970 + 2) = a0_19._0_8_;
    b_2[3] = (float)((int)b_2[3] + -4);
    local_960 = local_960 + 1;
    local_970 = local_970 + 4;
  }
  for (; 0 < (int)b_2[3]; b_2[3] = (float)((int)b_2[3] + -1)) {
    *local_970 = value2 - *(float *)*local_960;
    local_960 = (undefined1 (*) [16])(*local_960 + 4);
    local_970 = local_970 + 1;
  }
  for (i_9 = 0; i_9 < length; i_9 = i_9 + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(peVar9[i_9],value2 - value1);
    if (!bVar7) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x53;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  local_6c0 = peVar9;
  local_6b0 = local_250;
  for (b_3[3] = (float)length; 7 < (int)b_3[3]; b_3[3] = (float)((int)b_3[3] + -8)) {
    local_518 = (float)*(undefined8 *)*local_6b0;
    fStack_514 = (float)((ulong)*(undefined8 *)*local_6b0 >> 0x20);
    fStack_510 = (float)*(undefined8 *)(*local_6b0 + 8);
    fStack_50c = (float)((ulong)*(undefined8 *)(*local_6b0 + 8) >> 0x20);
    a1_7[3] = fStack_514 * value2;
    a1_7[2] = local_518 * value2;
    a0_21[1] = fStack_50c * value2;
    a0_21[0] = fStack_510 * value2;
    a0_22[2] = (float)*(undefined8 *)local_6b0[1];
    a0_22[3] = (float)((ulong)*(undefined8 *)local_6b0[1] >> 0x20);
    a1_7[0] = (float)*(undefined8 *)(local_6b0[1] + 8);
    a1_7[1] = (float)((ulong)*(undefined8 *)(local_6b0[1] + 8) >> 0x20);
    a0_22[3] = a0_22[3] * value2;
    a0_22[2] = a0_22[2] * value2;
    a1_7[1] = a1_7[1] * value2;
    a1_7[0] = a1_7[0] * value2;
    *(undefined8 *)local_6c0 = a1_7._8_8_;
    *(undefined8 *)(local_6c0 + 2) = a0_21._0_8_;
    *(undefined8 *)(local_6c0 + 4) = a0_22._8_8_;
    *(undefined8 *)(local_6c0 + 6) = a1_7._0_8_;
    local_6b0 = local_6b0 + 2;
    local_6c0 = local_6c0 + 8;
  }
  if (3 < (int)b_3[3]) {
    a0_23[2] = (float)*(undefined8 *)*local_6b0;
    a0_23[3] = (float)((ulong)*(undefined8 *)*local_6b0 >> 0x20);
    a0_22[0] = (float)*(undefined8 *)(*local_6b0 + 8);
    a0_22[1] = (float)((ulong)*(undefined8 *)(*local_6b0 + 8) >> 0x20);
    a0_23[3] = a0_23[3] * value2;
    a0_23[2] = a0_23[2] * value2;
    a0_22[1] = a0_22[1] * value2;
    a0_22[0] = a0_22[0] * value2;
    *(undefined8 *)local_6c0 = a0_23._8_8_;
    *(undefined8 *)(local_6c0 + 2) = a0_22._0_8_;
    b_3[3] = (float)((int)b_3[3] + -4);
    local_6b0 = local_6b0 + 1;
    local_6c0 = local_6c0 + 4;
  }
  for (; 0 < (int)b_3[3]; b_3[3] = (float)((int)b_3[3] + -1)) {
    *local_6c0 = *(float *)*local_6b0 * value2;
    local_6b0 = (undefined1 (*) [16])(*local_6b0 + 4);
    local_6c0 = local_6c0 + 1;
  }
  for (i_10 = 0; i_10 < length; i_10 = i_10 + 1) {
    if ((peVar9[i_10] != value1 * value2) || (NAN(peVar9[i_10]) || NAN(value1 * value2))) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x5b;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  uVar1 = CONCAT44(value2,value2);
  uVar2 = CONCAT44(value2,value2);
  local_490 = peVar9;
  local_480 = local_250;
  for (b_4[3] = (float)length; 7 < (int)b_4[3]; b_4[3] = (float)((int)b_4[3] + -8)) {
    auVar12._8_8_ = uVar2;
    auVar12._0_8_ = uVar1;
    auVar12 = divps(*local_480,auVar12);
    auVar11._8_8_ = uVar2;
    auVar11._0_8_ = uVar1;
    auVar11 = divps(local_480[1],auVar11);
    a1_8._8_8_ = auVar12._0_8_;
    a0_24._0_8_ = auVar12._8_8_;
    *(undefined8 *)local_490 = a1_8._8_8_;
    *(undefined8 *)(local_490 + 2) = a0_24._0_8_;
    a0_25._8_8_ = auVar11._0_8_;
    a1_8._0_8_ = auVar11._8_8_;
    *(undefined8 *)(local_490 + 4) = a0_25._8_8_;
    *(undefined8 *)(local_490 + 6) = a1_8._0_8_;
    local_480 = local_480 + 2;
    local_490 = local_490 + 8;
  }
  if (3 < (int)b_4[3]) {
    auVar3._8_8_ = uVar2;
    auVar3._0_8_ = uVar1;
    auVar11 = divps(*local_480,auVar3);
    a0_26._8_8_ = auVar11._0_8_;
    a0_25._0_8_ = auVar11._8_8_;
    *(undefined8 *)local_490 = a0_26._8_8_;
    *(undefined8 *)(local_490 + 2) = a0_25._0_8_;
    b_4[3] = (float)((int)b_4[3] + -4);
    local_480 = local_480 + 1;
    local_490 = local_490 + 4;
  }
  for (; 0 < (int)b_4[3]; b_4[3] = (float)((int)b_4[3] + -1)) {
    *local_490 = *(float *)*local_480 / value2;
    local_480 = (undefined1 (*) [16])(*local_480 + 4);
    local_490 = local_490 + 1;
  }
  for (local_1ecc = 0; local_1ecc < length; local_1ecc = local_1ecc + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(peVar9[local_1ecc],value1 / value2);
    if (!bVar7) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 99;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  uVar1 = CONCAT44(value2,value2);
  uVar2 = CONCAT44(value2,value2);
  local_260 = peVar9;
  for (b_5[3] = (float)length; 7 < (int)b_5[3]; b_5[3] = (float)((int)b_5[3] + -8)) {
    auVar5._8_8_ = uVar2;
    auVar5._0_8_ = uVar1;
    auVar11 = divps(auVar5,*local_250);
    auVar4._8_8_ = uVar2;
    auVar4._0_8_ = uVar1;
    auVar12 = divps(auVar4,local_250[1]);
    a1_9._8_8_ = auVar11._0_8_;
    a0_27._0_8_ = auVar11._8_8_;
    *(undefined8 *)local_260 = a1_9._8_8_;
    *(undefined8 *)(local_260 + 2) = a0_27._0_8_;
    a0_28._8_8_ = auVar12._0_8_;
    a1_9._0_8_ = auVar12._8_8_;
    *(undefined8 *)(local_260 + 4) = a0_28._8_8_;
    *(undefined8 *)(local_260 + 6) = a1_9._0_8_;
    local_250 = local_250 + 2;
    local_260 = local_260 + 8;
  }
  if (3 < (int)b_5[3]) {
    auVar6._8_8_ = uVar2;
    auVar6._0_8_ = uVar1;
    auVar11 = divps(auVar6,*local_250);
    a0_29._8_8_ = auVar11._0_8_;
    a0_28._0_8_ = auVar11._8_8_;
    *(undefined8 *)local_260 = a0_29._8_8_;
    *(undefined8 *)(local_260 + 2) = a0_28._0_8_;
    b_5[3] = (float)((int)b_5[3] + -4);
    local_250 = local_250 + 1;
    local_260 = local_260 + 4;
  }
  for (; 0 < (int)b_5[3]; b_5[3] = (float)((int)b_5[3] + -1)) {
    *local_260 = value2 / *(float *)*local_250;
    local_250 = (undefined1 (*) [16])(*local_250 + 4);
    local_260 = local_260 + 1;
  }
  for (local_1ed0 = 0; local_1ed0 < length; local_1ed0 = local_1ed0 + 1) {
    bVar7 = anon_unknown.dwarf_157a4::equal<float>(peVar9[local_1ed0],value2 / value1);
    if (!bVar7) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
      *(undefined4 *)(puVar10 + 1) = 0x6b;
      *(uint *)((long)puVar10 + 0xc) = length;
      __cxa_throw(puVar10,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) && ((peVar9[length] != 127.0 || (NAN(peVar9[length]))))) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar10 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
    *(undefined4 *)(puVar10 + 1) = 0x70;
    *(uint *)((long)puVar10 + 0xc) = length;
    __cxa_throw(puVar10,&Exception::typeinfo,0);
  }
  std::shared_ptr<float>::~shared_ptr((shared_ptr<float> *)&v1);
  std::shared_ptr<float>::~shared_ptr((shared_ptr<float> *)local_1e68);
  std::shared_ptr<float>::~shared_ptr
            ((shared_ptr<float> *)
             &pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}